

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

Float modelQuantization(Float value,PixelFormat format)

{
  Half local_a;
  
  if (format != Float) {
    if (format != Half) {
      pbrt::LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,100,"Unhandled pixel format");
    }
    pbrt::Half::Half(&local_a,value);
    value = pbrt::Half::operator_cast_to_float(&local_a);
  }
  return value;
}

Assistant:

static Float modelQuantization(Float value, PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return Clamp((value * 255.f) + 0.5f, 0, 255) * (1.f / 255.f);
    case PixelFormat::Half:
        return Float(Half(value));
    case PixelFormat::Float:
        return value;
    default:
        LOG_FATAL("Unhandled pixel format");
    }
}